

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

int * Cba_ObjAttrArray(Cba_Ntk_t *p,int i)

{
  uint uVar1;
  
  if (i < 0) {
    __assert_fail("i>=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                  ,0xf4,"int *Cba_ObjAttrArray(Cba_Ntk_t *, int)");
  }
  if (0 < (p->vObjAttr).nSize) {
    Vec_IntFillExtra(&p->vObjAttr,i + 1,0);
    if ((p->vObjAttr).nSize <= i) {
LAB_003acd2a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((p->vObjAttr).pArray[(uint)i] != 0) {
      if ((p->vObjAttr).nSize < 1) {
        uVar1 = 1;
      }
      else {
        Vec_IntFillExtra(&p->vObjAttr,i + 1,0);
        if ((p->vObjAttr).nSize <= i) goto LAB_003acd2a;
        uVar1 = (p->vObjAttr).pArray[(uint)i] + 1;
      }
      if ((-1 < (int)uVar1) && ((int)uVar1 < (p->vAttrSto).nSize)) {
        return (p->vAttrSto).pArray + uVar1;
      }
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
    }
  }
  return (int *)0x0;
}

Assistant:

static inline int *          Cba_ObjAttrArray( Cba_Ntk_t * p, int i )        { assert(i>=0); return Cba_ObjAttr(p, i) ? Vec_IntEntryP(&p->vAttrSto, Cba_ObjAttr(p, i)+1) : NULL; }